

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

QByteArray * __thiscall
QTimeZonePrivate::aliasToIana
          (QByteArray *__return_storage_ptr__,QTimeZonePrivate *this,QByteArrayView alias)

{
  _func_int ***ppp_Var1;
  long lVar2;
  int iVar3;
  QTimeZonePrivate *__n;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 *puVar8;
  
  uVar5 = 0x9a;
  puVar8 = QtTimeZoneCldr::aliasMappingTable;
  do {
    uVar4 = uVar5 >> 1;
    uVar6 = (ulong)*(ushort *)((long)puVar8 + uVar4 * 2 * 2);
    lVar7 = -1;
    do {
      lVar2 = lVar7 + uVar6 + 1;
      lVar7 = lVar7 + 1;
    } while ("Africa/Asmera"[lVar2] != '\0');
    iVar3 = qstrnicmp("Africa/Asmera" + uVar6,lVar7,(char *)alias.m_size,(qsizetype)this);
    uVar6 = uVar5 + ~uVar4;
    uVar5 = uVar4;
    if (iVar3 < 0) {
      puVar8 = (undefined1 *)((ushort *)((long)puVar8 + uVar4 * 2 * 2) + 2);
      uVar5 = uVar6;
    }
  } while (0 < (long)uVar5);
  if (puVar8 != &DAT_005a8778) {
    __n = (QTimeZonePrivate *)0xffffffffffffffff;
    do {
      ppp_Var1 = &__n->_vptr_QTimeZonePrivate;
      __n = (QTimeZonePrivate *)((long)&__n->_vptr_QTimeZonePrivate + 1);
    } while ("Africa/Asmera"[(long)ppp_Var1 + (ulong)*(ushort *)puVar8 + 1] != '\0');
    if ((this == __n) &&
       ((__n == (QTimeZonePrivate *)0x0 ||
        (iVar3 = bcmp("Africa/Asmera" + *(ushort *)puVar8,(char *)alias.m_size,(size_t)__n),
        iVar3 == 0)))) {
      lVar7 = -1;
      do {
        lVar2 = lVar7 + (ulong)*(ushort *)((long)puVar8 + 2) + 1;
        lVar7 = lVar7 + 1;
      } while ("Africa/Asmera"[lVar2] != '\0');
      QByteArray::QByteArray
                (__return_storage_ptr__,"Africa/Asmera" + *(ushort *)((long)puVar8 + 2),lVar7);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QByteArray QTimeZonePrivate::aliasToIana(QByteArrayView alias)
{
    const auto data = std::lower_bound(std::begin(aliasMappingTable), std::end(aliasMappingTable),
                                       alias, earlierAliasId);
    if (data != std::end(aliasMappingTable) && data->aliasId() == alias)
        return data->ianaId().toByteArray();
    // Note: empty return means not an alias, which is true of an ID that others
    // are aliases to, as the table omits self-alias entries. Let caller sort
    // that out, rather than allocating to return alias.toByteArray().
    return {};
}